

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void de::cmdline::selfTest(void)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  char *pcVar3;
  bool bVar4;
  ValueType *pVVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  ValueType *pVVar8;
  ValueType *pVVar9;
  undefined8 *puVar10;
  long lVar11;
  CommandLine cmdLine;
  Parser parser_1;
  Option<de::cmdline::TestIntOpt> local_248;
  Parser parser;
  ostringstream err;
  char *args [1];
  
  detail::Parser::Parser(&parser);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  p_Var1 = &cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ <<
       0x20;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  bVar4 = detail::Parser::parse(&parser,0,(char **)0x0,&cmdLine,(ostream *)&err);
  if (bVar4) {
    std::__cxx11::stringbuf::str();
    pcVar3 = local_248.longName;
    std::__cxx11::string::~string((string *)&local_248);
    if (pcVar3 != (char *)0x0) goto LAB_0031807b;
  }
  else {
LAB_0031807b:
    deAssertFail("parseOk && err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x166);
  }
  detail::CommandLine::~CommandLine(&cmdLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  args[0] = "-h";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  bVar4 = detail::Parser::parse(&parser,1,args,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x16f);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x170);
  }
  detail::CommandLine::~CommandLine(&cmdLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  args[0] = "--help";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  bVar4 = detail::Parser::parse(&parser,1,args,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x179);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x17a);
  }
  detail::CommandLine::~CommandLine(&cmdLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar10 = &DAT_003e1f90;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  bVar4 = detail::Parser::parse(&parser,3,(char **)&DAT_003e1f90,&cmdLine,(ostream *)&err);
  if (bVar4) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_248);
    if (local_248.longName == (char *)0x0) goto LAB_003182c9;
  }
  deAssertFail("parseOk && err.str().empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
               ,0x183);
LAB_003182c9:
  if ((long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x60) {
    deAssertFail("cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x184);
  }
  for (lVar11 = 0; lVar11 != 0x60; lVar11 = lVar11 + 0x20) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((cmdLine.m_args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar11),(char *)*puVar10);
    if (!bVar4) {
      deAssertFail("cmdLine.getArgs()[ndx] == args[ndx]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x187);
    }
    puVar10 = puVar10 + 1;
  }
  detail::CommandLine::~CommandLine(&cmdLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  std::
  _Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ::~_Vector_base((_Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                   *)&parser);
  detail::Parser::Parser(&parser_1);
  _err = "s";
  detail::Parser::addOption<de::cmdline::TestStringOpt>
            (&parser_1,(Option<de::cmdline::TestStringOpt> *)&err);
  cmdLine.m_options.m_fields._M_t._M_impl._0_8_ = (long)"-x" + 1;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       anon_var_dwarf_5acfb1;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)anon_var_dwarf_5acfbc;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x35e67f;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)parseType<std::__cxx11::string>;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  detail::Parser::addOption<de::cmdline::TestStringDefOpt>
            (&parser_1,(Option<de::cmdline::TestStringDefOpt> *)&cmdLine);
  local_248.shortName = "i";
  local_248.longName = "int";
  local_248.description = "Int option";
  local_248.defaultValue = (char *)0x0;
  local_248.parse = parseType<int>;
  local_248.namedValues = (NamedValue<int> *)0x0;
  local_248.namedValuesEnd = (NamedValue<int> *)0x0;
  detail::Parser::addOption<de::cmdline::TestIntOpt>(&parser_1,&local_248);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x35c856;
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_5ad00b;
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5ad016;
  detail::Parser::addOption<de::cmdline::TestBoolOpt>
            (&parser_1,(Option<de::cmdline::TestBoolOpt> *)&parser);
  args[0] = "n";
  detail::Parser::addOption<de::cmdline::TestNamedOpt>
            (&parser_1,(Option<de::cmdline::TestNamedOpt> *)args);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  std::__cxx11::stringbuf::str();
  uVar2 = cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  std::__cxx11::string::~string((string *)&cmdLine);
  if (uVar2 != 0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x19e);
  }
  detail::Parser::help(&parser_1,(ostream *)&err);
  std::__cxx11::stringbuf::str();
  uVar2 = cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  std::__cxx11::string::~string((string *)&cmdLine);
  if (uVar2 == 0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,0,(char **)0x0,&cmdLine,(ostream *)&err);
  if (!bVar4) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1a9);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1aa);
  }
  bVar4 = detail::TypedFieldMap::contains<de::cmdline::TestStringOpt>(&cmdLine.m_options);
  if (bVar4) {
    deAssertFail("!cmdLine.hasOption<TestStringOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ac);
  }
  bVar4 = detail::TypedFieldMap::contains<de::cmdline::TestIntOpt>(&cmdLine.m_options);
  if (bVar4) {
    deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ad);
  }
  pVVar5 = detail::TypedFieldMap::get<de::cmdline::TestNamedOpt>(&cmdLine.m_options);
  if (*pVVar5 != 1) {
    deAssertFail("cmdLine.getOption<TestNamedOpt>() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ae);
  }
  pVVar6 = detail::TypedFieldMap::get<de::cmdline::TestBoolOpt>(&cmdLine.m_options);
  if (*pVVar6 != false) {
    deAssertFail("cmdLine.getOption<TestBoolOpt>() == false",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1af);
  }
  pVVar7 = detail::TypedFieldMap::get<de::cmdline::TestStringDefOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar7,"foo");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse
                    (&parser_1,5,&PTR_anon_var_dwarf_5ad0cb_003e1fe0,&cmdLine,(ostream *)&err);
  if (!bVar4) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ba);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bb);
  }
  pVVar8 = detail::TypedFieldMap::get<de::cmdline::TestStringOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar8,"test value");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"test value\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bd);
  }
  pVVar9 = detail::TypedFieldMap::get<de::cmdline::TestIntOpt>(&cmdLine.m_options);
  if (*pVVar9 != 9) {
    deAssertFail("cmdLine.getOption<TestIntOpt>() == 9",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1be);
  }
  pVVar6 = detail::TypedFieldMap::get<de::cmdline::TestBoolOpt>(&cmdLine.m_options);
  if (*pVVar6 == false) {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bf);
  }
  pVVar5 = detail::TypedFieldMap::get<de::cmdline::TestNamedOpt>(&cmdLine.m_options);
  if (*pVVar5 != 0xffffffffffffffff) {
    deAssertFail("cmdLine.getOption<TestNamedOpt>() == ~0ull",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1c0);
  }
  pVVar7 = detail::TypedFieldMap::get<de::cmdline::TestStringDefOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar7,"foo");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1c1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse
                    (&parser_1,5,&PTR_anon_var_dwarf_5ad152_003e2010,&cmdLine,(ostream *)&err);
  if (!bVar4) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cb);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cc);
  }
  pVVar8 = detail::TypedFieldMap::get<de::cmdline::TestStringOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar8,"foo");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ce);
  }
  pVVar6 = detail::TypedFieldMap::get<de::cmdline::TestBoolOpt>(&cmdLine.m_options);
  if (*pVVar6 == false) {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cf);
  }
  bVar4 = detail::TypedFieldMap::contains<de::cmdline::TestIntOpt>(&cmdLine.m_options);
  if (bVar4) {
    deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d0);
  }
  if ((long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    deAssertFail("cmdLine.getArgs().size() == 2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d2);
  }
  bVar4 = std::operator==(cmdLine.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"--int=2");
  if (!bVar4) {
    deAssertFail("cmdLine.getArgs()[0] == \"--int=2\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d3);
  }
  bVar4 = std::operator==(cmdLine.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1,"-b");
  if (!bVar4) {
    deAssertFail("cmdLine.getArgs()[1] == \"-b\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d4);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,4,(char **)&DAT_003e2040,&cmdLine,(ostream *)&err);
  if (!bVar4) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1de);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1df);
  }
  pVVar8 = detail::TypedFieldMap::get<de::cmdline::TestStringOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar8,"--");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"--\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e1);
  }
  pVVar6 = detail::TypedFieldMap::get<de::cmdline::TestBoolOpt>(&cmdLine.m_options);
  if (*pVVar6 == false) {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e2);
  }
  bVar4 = detail::TypedFieldMap::contains<de::cmdline::TestIntOpt>(&cmdLine.m_options);
  if (bVar4) {
    deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e3);
  }
  if ((long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)cmdLine.m_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    deAssertFail("cmdLine.getArgs().size() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e5);
  }
  bVar4 = std::operator==(cmdLine.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"foo");
  if (!bVar4) {
    deAssertFail("cmdLine.getArgs()[0] == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e6);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ad1e4;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,1,(char **)&parser,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1f0);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1f1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ad1ef;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,1,(char **)&parser,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1fb);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1fc);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ad1fa;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,1,(char **)&parser,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x206);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x207);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ad205;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,1,(char **)&parser,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x211);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x212);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse
                    (&parser_1,2,&PTR_anon_var_dwarf_5ad210_003e2060,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x21c);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x21d);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse
                    (&parser_1,2,&PTR_anon_var_dwarf_5ad226_003e2070,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x227);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x228);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  parser.m_options.
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ad210;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse(&parser_1,1,(char **)&parser,&cmdLine,(ostream *)&err);
  if (bVar4) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x232);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x233);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  cmdLine.m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
  bVar4 = detail::Parser::parse
                    (&parser_1,4,&PTR_anon_var_dwarf_5ad23c_003e2080,&cmdLine,(ostream *)&err);
  if (!bVar4) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23d);
  }
  std::__cxx11::stringbuf::str();
  pcVar3 = local_248.longName;
  std::__cxx11::string::~string((string *)&local_248);
  if (pcVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23e);
  }
  pVVar8 = detail::TypedFieldMap::get<de::cmdline::TestStringOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar8,"");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23f);
  }
  pVVar7 = detail::TypedFieldMap::get<de::cmdline::TestStringDefOpt>(&cmdLine.m_options);
  bVar4 = std::operator==(pVVar7,"");
  if (!bVar4) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x240);
  }
  pVVar6 = detail::TypedFieldMap::get<de::cmdline::TestBoolOpt>(&cmdLine.m_options);
  if (*pVVar6 == false) {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x241);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
  detail::CommandLine::~CommandLine(&cmdLine);
  std::
  _Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ::~_Vector_base((_Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                   *)&parser_1);
  return;
}

Assistant:

void selfTest (void)
{
	// Parsing with no options.
	{
		Parser parser;

		{
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
		}

		{
			const char*			args[]		= { "-h" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "--help" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "foo", "bar", "baz baz" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
			DE_TEST_ASSERT(cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args));

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(args); ndx++)
				DE_TEST_ASSERT(cmdLine.getArgs()[ndx] == args[ndx]);
		}
	}

	// Parsing with options.
	{
		Parser parser;

		static const NamedValue<deUint64> s_namedValues[] =
		{
			{ "zero",	0		},
			{ "one",	1		},
			{ "huge",	~0ull	}
		};

		parser << Option<TestStringOpt>		("s",	"string",	"String option")
			   << Option<TestStringDefOpt>	("x",	"xyz",		"String option w/ default value",	"foo")
			   << Option<TestIntOpt>		("i",	"int",		"Int option")
			   << Option<TestBoolOpt>		("b",	"bool",		"Test boolean flag")
			   << Option<TestNamedOpt>		("n",	"named",	"Test named opt",	DE_ARRAY_BEGIN(s_namedValues),	DE_ARRAY_END(s_namedValues),	"one");

		{
			std::ostringstream err;
			DE_TEST_ASSERT(err.str().empty());
			parser.help(err);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Default values
		{
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(!cmdLine.hasOption<TestStringOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == 1);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>() == false);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// Basic parsing
		{
			const char*			args[]	= { "-s", "test value", "-b", "-i=9", "--named=huge" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "test value");
			DE_TEST_ASSERT(cmdLine.getOption<TestIntOpt>() == 9);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == ~0ull);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// End of argument list (--)
		{
			const char*			args[]	= { "--string=foo", "-b", "--", "--int=2", "-b" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "foo");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 2);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "--int=2");
			DE_TEST_ASSERT(cmdLine.getArgs()[1] == "-b");
		}

		// Value --
		{
			const char*			args[]	= { "--string", "--", "-b", "foo" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "--");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 1);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "foo");
		}

		// Invalid flag usage
		{
			const char*			args[]	= { "-b=true" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid named option
		{
			const char*			args[]	= { "-n=two" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (-x)
		{
			const char*			args[]	= { "-x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (--xxx)
		{
			const char*			args[]	= { "--xxx" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid int value
		{
			const char*			args[]	= { "--int", "1x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Arg specified multiple times
		{
			const char*			args[]	= { "-s=2", "-s=3" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Missing value
		{
			const char*			args[]	= { "--int" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Empty value --arg=
		{
			const char*			args[]	= { "--string=", "-b", "-x", "" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());
			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
		}
	}
}